

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O0

void __thiscall agge::tests::MiscTests::AddingVectorToAPointShiftsIt(MiscTests *this)

{
  allocator local_359;
  string local_358 [32];
  LocationInfo local_338;
  point<int> local_30c;
  point<int> local_304;
  allocator local_2f9;
  string local_2f8 [32];
  LocationInfo local_2d8;
  point<int> local_2ac;
  point<int> local_2a4;
  allocator local_299;
  string local_298 [32];
  LocationInfo local_278;
  point<int> local_24c;
  point<int> local_244;
  allocator local_239;
  string local_238 [32];
  LocationInfo local_218;
  point<int> local_1ec;
  point<int> local_1e4;
  allocator local_1d9;
  string local_1d8 [32];
  LocationInfo local_1b8;
  point<float> local_18c;
  point<float> local_184;
  allocator local_179;
  string local_178 [32];
  LocationInfo local_158;
  point<float> local_12c;
  point<float> local_124;
  allocator local_119;
  string local_118 [32];
  LocationInfo local_f8;
  point<float> local_cc;
  point<float> local_c4 [3];
  allocator local_a9;
  string local_a8 [32];
  LocationInfo local_88;
  point<float> local_60;
  point<float> local_58;
  agge_vector<int> local_50;
  agge_vector<int> v4;
  agge_vector<int> v3;
  vector_r v2;
  vector_r v1;
  point<int> p4;
  point<int> p3;
  point_r p2;
  point_r p1;
  MiscTests *this_local;
  
  p2.x = -1.202;
  p2.y = 311.9;
  p3.x = 0x428e6666;
  p3.y = -0x3ec9c28f;
  p4.x = -9;
  p4.y = 0xd;
  v1.dx = 1.27658e-42;
  v1.dy = 2.77177e-42;
  v2.dx = 0.7;
  v2.dy = 51.7;
  v3.dx = 0x40f66666;
  v3.dy = 0x40b66666;
  v4.dx = 0x51;
  v4.dy = -0xab;
  local_50.dx = -7;
  local_50.dy = 0x13;
  local_58 = create_point<float>(-0.50200003,363.6);
  local_60 = operator+(&p2,&v2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_a9);
  ut::LocationInfo::LocationInfo(&local_88,(string *)local_a8,0x72);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_58,&local_60,&local_88);
  ut::LocationInfo::~LocationInfo(&local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_c4[0] = create_point<float>(6.4979997,317.6);
  local_cc = operator+(&p2,(agge_vector<float> *)&v3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_119);
  ut::LocationInfo::LocationInfo(&local_f8,(string *)local_118,0x73);
  ut::are_equal<agge::point<float>,agge::point<float>>(local_c4,&local_cc,&local_f8);
  ut::LocationInfo::~LocationInfo(&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_124 = create_point<float>(71.899994,40.31);
  local_12c = operator+((point<float> *)&p3,&v2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_179);
  ut::LocationInfo::LocationInfo(&local_158,(string *)local_178,0x74);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_124,&local_12c,&local_158);
  ut::LocationInfo::~LocationInfo(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_184 = create_point<float>(78.899994,-5.6900005);
  local_18c = operator+((point<float> *)&p3,(agge_vector<float> *)&v3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_1d9);
  ut::LocationInfo::LocationInfo(&local_1b8,(string *)local_1d8,0x75);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_184,&local_18c,&local_1b8);
  ut::LocationInfo::~LocationInfo(&local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1e4 = create_point<int>(0x48,-0x9e);
  local_1ec = operator+(&p4,&v4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_239);
  ut::LocationInfo::LocationInfo(&local_218,(string *)local_238,0x77);
  ut::are_equal<agge::point<int>,agge::point<int>>(&local_1e4,&local_1ec,&local_218);
  ut::LocationInfo::~LocationInfo(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  local_244 = create_point<int>(-0x10,0x20);
  local_24c = operator+(&p4,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_298,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_299);
  ut::LocationInfo::LocationInfo(&local_278,(string *)local_298,0x78);
  ut::are_equal<agge::point<int>,agge::point<int>>(&local_244,&local_24c,&local_278);
  ut::LocationInfo::~LocationInfo(&local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  local_2a4 = create_point<int>(0x3e0,0x70f);
  local_2ac = operator+((point<int> *)&v1,&v4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_2f9);
  ut::LocationInfo::LocationInfo(&local_2d8,(string *)local_2f8,0x79);
  ut::are_equal<agge::point<int>,agge::point<int>>(&local_2a4,&local_2ac,&local_2d8);
  ut::LocationInfo::~LocationInfo(&local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  local_304 = create_point<int>(0x388,0x7cd);
  local_30c = operator+((point<int> *)&v1,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_359);
  ut::LocationInfo::LocationInfo(&local_338,(string *)local_358,0x7a);
  ut::are_equal<agge::point<int>,agge::point<int>>(&local_304,&local_30c,&local_338);
  ut::LocationInfo::~LocationInfo(&local_338);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  return;
}

Assistant:

test( AddingVectorToAPointShiftsIt )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f };
				const point<int> p3 = { -9, 13 }, p4 = { 911, 1978 };
				const vector_r v1 = { 0.7f, 51.7f }, v2 = { 7.7f, 5.7f };
				const agge_vector<int> v3 = { 81, -171 }, v4 = { -7, 19 };

				// ACT / ASSERT
				assert_equal(create_point(-1.202f + 0.7f, 311.9f + 51.7f), p1 + v1);
				assert_equal(create_point(-1.202f + 7.7f, 311.9f + 5.7f), p1 + v2);
				assert_equal(create_point(71.2f + 0.7f, -11.39f + 51.7f), p2 + v1);
				assert_equal(create_point(71.2f + 7.7f, -11.39f + 5.7f), p2 + v2);

				assert_equal(create_point(-9 + 81, 13 + -171), p3 + v3);
				assert_equal(create_point(-9 + -7, 13 + 19), p3 + v4);
				assert_equal(create_point(911 + 81, 1978 + -171), p4 + v3);
				assert_equal(create_point(911 + -7, 1978 + 19), p4 + v4);
			}